

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerBrFncCachedScopeEq(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  RegOpnd *baseOpnd;
  IndirOpnd *compareSrc1;
  BranchInstr *pBVar6;
  Lowerer *this_00;
  
  OVar3 = instr->m_opcode;
  if ((OVar3 & ~ExtendedOpcodePrefix) != BrFncCachedScopeEq) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6c8a,
                       "(instr->m_opcode == Js::OpCode::BrFncCachedScopeEq || instr->m_opcode == Js::OpCode::BrFncCachedScopeNeq)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrFncCachedScopeEq || instr->m_opcode == Js::OpCode::BrFncCachedScopeNeq"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    OVar3 = instr->m_opcode;
  }
  pOVar5 = IR::Instr::UnlinkSrc1(instr);
  baseOpnd = IR::Opnd::AsRegOpnd(pOVar5);
  compareSrc1 = IR::IndirOpnd::New(baseOpnd,0x38,TyInt64,this->m_func,false);
  pOVar5 = IR::Instr::UnlinkSrc2(instr);
  this_00 = (Lowerer *)instr;
  pBVar6 = IR::Instr::AsBranchInstr(instr);
  InsertCompareBranch(this_00,&compareSrc1->super_Opnd,pOVar5,OVar3 == BrFncCachedScopeEq ^ BrNeq_A,
                      false,pBVar6->m_branchTarget,instr->m_next,false);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void Lowerer::LowerBrFncCachedScopeEq(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::BrFncCachedScopeEq || instr->m_opcode == Js::OpCode::BrFncCachedScopeNeq);
    Js::OpCode opcode = (instr->m_opcode == Js::OpCode::BrFncCachedScopeEq ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A);

    IR::RegOpnd *src1Reg = instr->UnlinkSrc1()->AsRegOpnd();

    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(src1Reg, Js::ScriptFunction::GetOffsetOfCachedScopeObj(), TyMachReg, this->m_func);
    this->InsertCompareBranch(indirOpnd, instr->UnlinkSrc2(), opcode, false, instr->AsBranchInstr()->GetTarget(), instr->m_next);

    instr->Remove();
}